

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_Pixmap *pxm,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  char **cdata;
  int iVar1;
  int w;
  int local_38;
  int local_34;
  
  cdata = (pxm->super_Fl_Image).data_;
  iVar1 = fl_measure_pixmap(cdata,&local_34,&local_38);
  if (iVar1 != 0) {
    this->mask = (uchar *)0x0;
    fl_mask_bitmap = &this->mask;
    this->mx = WP;
    this->my = HP;
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
              (this,(ulong)(uint)XP,(ulong)(uint)YP,(ulong)(uint)WP,(ulong)(uint)HP);
    fl_draw_pixmap(cdata,XP - cx,YP - cy,0x38);
    (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])(this);
    if (this->mask != (uchar *)0x0) {
      operator_delete__(this->mask);
    }
    this->mask = (uchar *)0x0;
    fl_mask_bitmap = (uchar **)0x0;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_Pixmap * pxm,int XP, int YP, int WP, int HP, int cx, int cy){
  const char * const * di =pxm->data();
  int w,h;
  if (!fl_measure_pixmap(di, w, h)) return;
  mask=0;
  fl_mask_bitmap=&mask;
  mx = WP;
  my = HP;
  push_clip(XP, YP, WP, HP);
  fl_draw_pixmap(di,XP -cx, YP -cy, FL_BLACK );
  pop_clip();
  delete[] mask;
  mask=0;
  fl_mask_bitmap=0;
}